

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WDString.cpp
# Opt level: O3

int index_kmp(string *S,string *T,int *next)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = T->_M_string_length;
  if (S->_M_string_length == 0) {
    uVar4 = 1;
    iVar2 = 1;
  }
  else {
    iVar3 = 1;
    uVar4 = 1;
    iVar2 = 1;
    do {
      if (uVar1 < (ulong)(long)iVar3) break;
      if ((iVar3 == 0) || ((S->_M_dataplus)._M_p[uVar4] == (T->_M_dataplus)._M_p[uVar4])) {
        iVar2 = iVar2 + 1;
        iVar3 = iVar3 + 1;
      }
      else {
        iVar3 = next[iVar3];
      }
      uVar4 = (ulong)iVar2;
    } while (uVar4 <= S->_M_string_length);
    uVar4 = (ulong)iVar3;
  }
  iVar3 = 0;
  if (uVar1 < uVar4) {
    iVar3 = iVar2 - (int)uVar1;
  }
  return iVar3;
}

Assistant:

int index_kmp(string S,string T,int next[])
{
    int i = 1, j = 1;
    while(i<=S.length() && j <=T.length())
    {
        if(j==0||S[i]==T[i])
        {
            ++i; ++j;
        }
        else j = next[j];
    }
    return (j>T.length()? i-T.length():0);
}